

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeImpl.cc
# Opt level: O2

void __thiscall avro::NodeArray::printJson(NodeArray *this,ostream *os,int depth)

{
  indent x;
  element_type *peVar1;
  
  std::operator<<(os,"{\n");
  x.d = depth + 1;
  operator<<(os,x);
  std::operator<<(os,"\"type\": \"array\",\n");
  operator<<(os,x);
  std::operator<<(os,"\"items\": ");
  peVar1 = (this->super_NodeImplArray).leafAttributes_.attr_.px;
  (*peVar1->_vptr_Node[0xd])(peVar1,os,(ulong)(uint)x.d);
  std::operator<<(os,'\n');
  operator<<(os,(indent)depth);
  std::operator<<(os,'}');
  return;
}

Assistant:

void 
NodeArray::printJson(std::ostream &os, int depth) const
{
    os << "{\n";
    os << indent(depth+1) << "\"type\": \"array\",\n";
    os << indent(depth+1) <<  "\"items\": ";
    leafAttributes_.get()->printJson(os, depth+1);
    os << '\n';
    os << indent(depth) << '}';
}